

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_ld_preincr(DisasContext_conflict14 *ctx,TCGv_i32 r1,TCGv_i32 r2,int16_t off,MemOp mop)

{
  TCGContext_conflict9 *tcg_ctx;
  TCGv_i32 ret;
  undefined6 in_register_0000000a;
  uintptr_t o;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  ret = tcg_temp_new_i32(tcg_ctx);
  tcg_gen_addi_i32_tricore(tcg_ctx,ret,r2,(int32_t)CONCAT62(in_register_0000000a,off));
  tcg_gen_qemu_ld_i32_tricore(tcg_ctx,r1,ret,(long)ctx->mem_idx,mop);
  tcg_gen_mov_i32(tcg_ctx,r2,ret);
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_ld_preincr(DisasContext *ctx, TCGv r1, TCGv r2, int16_t off,
                           MemOp mop)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    TCGv temp = tcg_temp_new(tcg_ctx);
    tcg_gen_addi_tl(tcg_ctx, temp, r2, off);
    tcg_gen_qemu_ld_tl(tcg_ctx, r1, temp, ctx->mem_idx, mop);
    tcg_gen_mov_tl(tcg_ctx, r2, temp);
    tcg_temp_free(tcg_ctx, temp);
}